

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O2

void kratos::uniquify_generators(Generator *top)

{
  string *new_name_00;
  size_t sVar1;
  _Hash_node_base *p_Var2;
  pointer ppGVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  iterator iVar6;
  mapped_type *ppGVar7;
  uint64_t head;
  long lVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __node_base_ptr p_Var9;
  uint uVar10;
  uint64_t i;
  ulong uVar11;
  __node_base _Var12;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_kratos::Generator_*>,_false,_false>,_bool>
  pVar13;
  basic_string_view<char> bVar14;
  string_view format_str;
  format_args args;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_180;
  undefined1 local_148 [8];
  string new_name;
  string old_name;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_names;
  set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  module_sets;
  unordered_map<unsigned_long,_kratos::Generator_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>_>
  name_map;
  vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> module_instances;
  uint64_t hash;
  Generator *local_40;
  Generator *ptr;
  
  ptr = (Generator *)top->context_;
  Context::get_generator_names_abi_cxx11_
            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_180,(Context *)ptr);
  _Var12._M_nxt = local_180._M_before_begin._M_nxt;
  while( true ) {
    if (_Var12._M_nxt == (_Hash_node_base *)0x0) break;
    Context::get_generators_by_name
              ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)&new_names._M_h._M_single_bucket,(Context *)ptr,(string *)(_Var12._M_nxt + 1));
    name_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    module_instances.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    module_instances.super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::reserve
              ((vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
               &name_map._M_h._M_single_bucket,
               (size_type)module_sets._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    for (p_Var5 = module_sets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 != (_Rb_tree_node_base *)&module_sets;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      sVar1 = *(size_t *)(p_Var5 + 1);
      if ((*(long *)(sVar1 + 0xe0) == *(long *)(sVar1 + 0xe8)) &&
         ((*(byte *)(sVar1 + 0x2d9) & 1) == 0)) {
        module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar1;
        std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
        emplace_back<kratos::Generator*>
                  ((vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
                   &name_map._M_h._M_single_bucket,
                   (Generator **)&module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
    if ((long)module_instances.
              super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
              super__Vector_impl_data._M_start - (long)name_map._M_h._M_single_bucket != 8) {
      if (*(char *)&(ptr->lib_files_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == '\x01') {
        lVar8 = 0;
        for (uVar11 = 0;
            uVar11 < (ulong)((long)module_instances.
                                   super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start -
                             (long)name_map._M_h._M_single_bucket >> 3); uVar11 = uVar11 + 1) {
          bVar4 = Context::is_generated_tracked
                            ((Context *)ptr,
                             (Generator *)name_map._M_h._M_single_bucket[uVar11]._M_nxt);
          if (bVar4) {
            p_Var2 = name_map._M_h._M_single_bucket[uVar11]._M_nxt;
            name_map._M_h._M_single_bucket[uVar11]._M_nxt =
                 name_map._M_h._M_single_bucket[lVar8]._M_nxt;
            name_map._M_h._M_single_bucket[lVar8]._M_nxt = p_Var2;
            lVar8 = lVar8 + 1;
          }
        }
      }
      ppGVar3 = module_instances.
                super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&name_map._M_h._M_rehash_policy._M_next_resize;
      name_map._M_h._M_buckets = (__buckets_ptr)0x1;
      name_map._M_h._M_bucket_count = 0;
      name_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      name_map._M_h._M_element_count._0_4_ = 0x3f800000;
      name_map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      name_map._M_h._M_rehash_policy._4_4_ = 0;
      name_map._M_h._M_rehash_policy._M_next_resize = 0;
      old_name.field_2._8_8_ = &new_names._M_h._M_rehash_policy._M_next_resize;
      new_names._M_h._M_buckets = (__buckets_ptr)0x1;
      new_names._M_h._M_bucket_count = 0;
      new_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      new_names._M_h._M_element_count._0_4_ = 0x3f800000;
      new_names._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      new_names._M_h._M_rehash_policy._4_4_ = 0;
      new_names._M_h._M_rehash_policy._M_next_resize = 0;
      for (p_Var9 = name_map._M_h._M_single_bucket; p_Var9 != (__node_base_ptr)ppGVar3;
          p_Var9 = p_Var9 + 1) {
        local_40 = (Generator *)p_Var9->_M_nxt;
        bVar4 = Context::has_hash((Context *)ptr,local_40);
        if (bVar4) {
          module_instances.
          super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)Context::get_hash((Context *)ptr,local_40);
          iVar6 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)&module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (key_type_conflict *)
                         &module_instances.
                          super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (iVar6.
              super__Node_iterator_base<std::pair<const_unsigned_long,_kratos::Generator_*>,_false>.
              _M_cur == (__node_type *)0x0) {
            pVar13 = std::
                     _Hashtable<unsigned_long,std::pair<unsigned_long_const,kratos::Generator*>,std::allocator<std::pair<unsigned_long_const,kratos::Generator*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::_M_emplace<unsigned_long&,kratos::Generator*const&>
                               ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,kratos::Generator*>,std::allocator<std::pair<unsigned_long_const,kratos::Generator*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)&module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                &module_instances.
                                 super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_40);
            if (new_names._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
              std::
              _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<std::__cxx11::string&>
                        ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)((long)&old_name.field_2 + 8),&local_40->name,pVar13._8_8_);
            }
            else {
              uVar10 = (int)new_names._M_h._M_before_begin._M_nxt - 1;
              while( true ) {
                old_name._M_string_length = (size_type)uVar10;
                new_name.field_2._8_8_ = _Var12._M_nxt[1]._M_nxt;
                old_name._M_dataplus._M_p = (pointer)_Var12._M_nxt[2]._M_nxt;
                bVar14 = fmt::v7::to_string_view<char,_0>("{0}_unq{1}");
                format_str.data_ = (char *)bVar14.size_;
                format_str.size_ = 0x2d;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .field_1.args_ = in_R9.args_;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .desc_ = (unsigned_long_long)((long)&new_name.field_2 + 8);
                fmt::v7::detail::vformat_abi_cxx11_
                          ((string *)local_148,(detail *)bVar14.data_,format_str,args);
                bVar4 = Context::generator_name_exists((Context *)ptr,(string *)local_148);
                if (!bVar4) break;
                std::__cxx11::string::~string((string *)local_148);
                uVar10 = uVar10 + 1;
              }
              Context::change_generator_name((Context *)ptr,local_40,(string *)local_148);
              std::__cxx11::string::~string((string *)local_148);
              std::
              _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<std::__cxx11::string&>
                        ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)((long)&old_name.field_2 + 8),&local_40->name);
            }
          }
          else {
            ppGVar7 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (key_type *)
                           &module_instances.
                            super__Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            new_name_00 = (string *)(new_name.field_2._M_local_buf + 8);
            std::__cxx11::string::string((string *)new_name_00,(string *)&(*ppGVar7)->name);
            Context::change_generator_name((Context *)ptr,local_40,new_name_00);
            std::__cxx11::string::~string((string *)new_name_00);
          }
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)((long)&old_name.field_2 + 8));
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_kratos::Generator_*>,_std::allocator<std::pair<const_unsigned_long,_kratos::Generator_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&module_sets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    std::_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>::~_Vector_base
              ((_Vector_base<kratos::Generator_*,_std::allocator<kratos::Generator_*>_> *)
               &name_map._M_h._M_single_bucket);
    std::
    _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                 *)&new_names._M_h._M_single_bucket);
    _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_180);
  return;
}

Assistant:

void uniquify_generators(Generator* top) {
    // we assume users has run the hash_generators function
    Context* context = top->context();
    auto const& names = context->get_generator_names();
    for (auto const& name : names) {
        auto const module_sets = context->get_generators_by_name(name);
        std::vector<Generator*> module_instances;
        module_instances.reserve(module_sets.size());
        for (auto const& m : module_sets) {
            if (m->external()) continue;
            module_instances.emplace_back(m.get());
        }
        // notice that since it is a set copied by value, it is fine to iterate through it
        if (module_instances.size() == 1)
            // only one module. we are good
            continue;
        // reordering based on whether it's being tracked
        if (context->track_generated()) {
            // O(n) algorithm. it does not need to be inplace
            uint64_t head = 0;
            for (uint64_t i = 0; i < module_instances.size(); i++) {
                if (context->is_generated_tracked(module_instances[i])) {
                    // swap
                    std::swap(module_instances[i], module_instances[head]);
                    head++;
                }
            }
        }
        std::unordered_map<uint64_t, Generator*> name_map;
        std::unordered_set<std::string> new_names;
        for (auto* const ptr : module_instances) {
            if (context->has_hash(ptr)) {
                uint64_t hash = context->get_hash(ptr);
                if (name_map.find(hash) == name_map.end()) {
                    // need to uniquify it
                    name_map.emplace(hash, ptr);
                    if (new_names.empty()) {
                        // use the original name
                        new_names.emplace(ptr->name);
                    } else {
                        // find a new one
                        uint32_t count = new_names.size() - 1;
                        while (true) {
                            const std::string new_name = ::format("{0}_unq{1}", name, count++);
                            if (!context->generator_name_exists(new_name)) {
                                context->change_generator_name(ptr, new_name);
                                break;
                            }
                        }
                        new_names.emplace(ptr->name);
                    }
                } else {
                    // re-use the old name
                    auto old_name = name_map.at(hash)->name;
                    context->change_generator_name(ptr, old_name);
                }
            }
        }
    }
}